

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O1

void __thiscall ctemplate::TemplateCache::Freeze(TemplateCache *this)

{
  bool bVar1;
  int iVar2;
  Mutex *pMVar3;
  
  pMVar3 = this->mutex_;
  iVar2 = pMVar3->mutex_;
  pMVar3->mutex_ = iVar2 + 1;
  if (iVar2 < 0) {
    __assert_fail("++mutex_ > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                  ,0xef,"void ctemplate::Mutex::ReaderLock()");
  }
  bVar1 = this->is_frozen_;
  pMVar3->mutex_ = iVar2;
  if (bVar1 == false) {
    ReloadAllIfChanged(this,IMMEDIATE_RELOAD);
    pMVar3 = this->mutex_;
    iVar2 = pMVar3->mutex_;
    pMVar3->mutex_ = iVar2 + -1;
    if (iVar2 != 0) {
      __assert_fail("--mutex_ == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                    ,0xea,"void ctemplate::Mutex::Lock()");
    }
    this->is_frozen_ = true;
    pMVar3->mutex_ = 0;
  }
  return;
}

Assistant:

void TemplateCache::Freeze() {
  {
    ReaderMutexLock ml(mutex_);
    if (is_frozen_) {  // if already frozen, then this is a no-op.
      return;
    }
  }
  // A final reload before freezing the cache.
  ReloadAllIfChanged(IMMEDIATE_RELOAD);
  {
    WriterMutexLock ml(mutex_);
    is_frozen_ = true;
  }
}